

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_32x32_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int32_t iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  code *pcVar22;
  uint uVar23;
  int32_t *piVar24;
  uint uVar25;
  int *piVar26;
  long lVar27;
  code *pcVar28;
  ulong uVar29;
  ulong uVar30;
  int32_t *piVar31;
  __m128i round;
  undefined1 auVar32 [16];
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [1024];
  TXFM_2D_FLIP_CFG local_1078;
  int local_1038 [1026];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x03',&local_1078);
  uVar3 = tx_size_wide[local_1078.tx_size];
  uVar20 = (ulong)uVar3;
  pcVar22 = fdct32_sse4_1;
  pcVar28 = fdct32_sse4_1;
  if (local_1078.txfm_type_col != '\x03') {
    if (local_1078.txfm_type_col == '\v') {
      pcVar28 = idtx32x32_sse4_1;
    }
    else if (local_1078.txfm_type_col == '\x04') {
      pcVar28 = fdct64_new_sse4_1;
    }
    else {
      pcVar28 = (code *)0x0;
    }
  }
  if (local_1078.txfm_type_row != '\x03') {
    if (local_1078.txfm_type_row == '\v') {
      pcVar22 = idtx32x32_sse4_1;
    }
    else if (local_1078.txfm_type_row == '\x04') {
      pcVar22 = fdct64_new_sse4_1;
    }
    else {
      pcVar22 = (code *)0x0;
    }
  }
  piVar26 = local_1038;
  uVar29 = 0;
  do {
    uVar30 = 0;
    do {
      piVar26[uVar30] = (int)input[uVar30];
      uVar30 = uVar30 + 1;
    } while (uVar20 != uVar30);
    uVar29 = uVar29 + 1;
    piVar26 = piVar26 + uVar20;
    input = input + stride;
  } while (uVar29 != uVar20);
  uVar25 = uVar3 * uVar3;
  uVar23 = uVar25 >> 2;
  bVar2 = *local_1078.shift;
  if ((char)bVar2 < '\0') {
    if (3 < uVar25) {
      iVar21 = 1 << (~bVar2 & 0x1f);
      uVar29 = (ulong)uVar23;
      lVar27 = 0;
      auVar32 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        iVar18 = *(int *)((long)local_1038 + lVar27 + 4);
        iVar5 = *(int *)((long)local_1038 + lVar27 + 8);
        iVar6 = *(int *)((long)local_1038 + lVar27 + 0xc);
        piVar26 = (int *)((long)output + lVar27);
        *piVar26 = *(int *)((long)local_1038 + lVar27) + iVar21 >> auVar32;
        piVar26[1] = iVar18 + iVar21 >> auVar32;
        piVar26[2] = iVar5 + iVar21 >> auVar32;
        piVar26[3] = iVar6 + iVar21 >> auVar32;
        lVar27 = lVar27 + 0x10;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
    }
  }
  else if (3 < uVar25) {
    uVar29 = (ulong)uVar23;
    lVar27 = 0;
    do {
      iVar21 = *(int *)((long)local_1038 + lVar27 + 4);
      iVar18 = *(int *)((long)local_1038 + lVar27 + 8);
      iVar5 = *(int *)((long)local_1038 + lVar27 + 0xc);
      piVar26 = (int *)((long)output + lVar27);
      *piVar26 = *(int *)((long)local_1038 + lVar27) << (int)(char)bVar2;
      piVar26[1] = iVar21;
      piVar26[2] = iVar18;
      piVar26[3] = iVar5;
      lVar27 = lVar27 + 0x10;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
  }
  (*pcVar28)(output,local_1038,(int)local_1078.cos_bit_col,local_1078.stage_range_col);
  iVar21 = (int)local_1078.shift[1];
  if (iVar21 < 0) {
    if (3 < uVar25) {
      iVar18 = 1 << (~local_1078.shift[1] & 0x1fU);
      uVar29 = (ulong)uVar23;
      lVar27 = 0;
      auVar32 = ZEXT416((uint)-iVar21);
      do {
        iVar21 = *(int *)((long)local_1038 + lVar27 + 4);
        iVar5 = *(int *)((long)local_1038 + lVar27 + 8);
        iVar6 = *(int *)((long)local_1038 + lVar27 + 0xc);
        piVar26 = (int *)((long)output + lVar27);
        *piVar26 = *(int *)((long)local_1038 + lVar27) + iVar18 >> auVar32;
        piVar26[1] = iVar21 + iVar18 >> auVar32;
        piVar26[2] = iVar5 + iVar18 >> auVar32;
        piVar26[3] = iVar6 + iVar18 >> auVar32;
        lVar27 = lVar27 + 0x10;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
    }
  }
  else if (3 < uVar25) {
    uVar29 = (ulong)uVar23;
    lVar27 = 0;
    do {
      iVar18 = *(int *)((long)local_1038 + lVar27 + 4);
      iVar5 = *(int *)((long)local_1038 + lVar27 + 8);
      iVar6 = *(int *)((long)local_1038 + lVar27 + 0xc);
      piVar26 = (int *)((long)output + lVar27);
      *piVar26 = *(int *)((long)local_1038 + lVar27) << iVar21;
      piVar26[1] = iVar18;
      piVar26[2] = iVar5;
      piVar26[3] = iVar6;
      lVar27 = lVar27 + 0x10;
      uVar29 = uVar29 - 1;
    } while (uVar29 != 0);
  }
  uVar4 = uVar3 >> 2;
  uVar29 = (ulong)uVar4;
  uVar30 = 0;
  piVar31 = output;
  do {
    iVar21 = 0;
    uVar19 = uVar29;
    piVar24 = piVar31;
    do {
      lVar27 = (long)iVar21;
      iVar18 = piVar24[1];
      iVar7 = piVar24[2];
      iVar5 = piVar24[3];
      piVar26 = piVar24 + uVar29 * 8;
      iVar6 = *piVar26;
      iVar8 = piVar26[1];
      iVar9 = piVar26[2];
      iVar10 = piVar26[3];
      piVar1 = piVar24 + uVar29 * 4;
      iVar11 = piVar1[1];
      iVar12 = piVar1[2];
      iVar13 = piVar1[3];
      piVar26 = piVar24 + uVar29 * 0xc;
      iVar14 = *piVar26;
      iVar15 = piVar26[1];
      iVar16 = piVar26[2];
      iVar17 = piVar26[3];
      piVar26 = local_1038 + uVar30 + lVar27 * 4;
      *(ulong *)piVar26 = CONCAT44(*piVar1,*piVar24);
      piVar26[4] = iVar6;
      piVar26[5] = iVar14;
      piVar26 = local_1038 + uVar30 + lVar27 * 4 + uVar29 * 4;
      *piVar26 = iVar18;
      piVar26[1] = iVar11;
      piVar26[2] = iVar8;
      piVar26[3] = iVar15;
      piVar26 = local_1038 + uVar30 + lVar27 * 4 + (ulong)(uVar4 * 2) * 4;
      *(ulong *)piVar26 = CONCAT44(iVar12,iVar7);
      piVar26[4] = iVar9;
      piVar26[5] = iVar16;
      piVar26 = local_1038 + uVar30 + lVar27 * 4 + (ulong)(uVar4 * 3) * 4;
      *piVar26 = iVar5;
      piVar26[1] = iVar13;
      piVar26[2] = iVar10;
      piVar26[3] = iVar17;
      iVar21 = iVar21 + (uVar3 & 0x7ffffffc);
      piVar24 = piVar24 + 4;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
    uVar30 = uVar30 + 4;
    piVar31 = piVar31 + uVar29 * 0x10;
  } while (uVar30 < uVar20);
  (*pcVar22)(local_1038,output,(int)local_1078.cos_bit_row,local_1078.stage_range_row);
  bVar2 = local_1078.shift[2];
  if ((char)bVar2 < '\0') {
    if (3 < uVar25) {
      iVar21 = 1 << (~bVar2 & 0x1f);
      uVar20 = (ulong)uVar23;
      auVar32 = ZEXT416((uint)-(int)(char)bVar2);
      do {
        *output = *output + iVar21 >> auVar32;
        output[1] = output[1] + iVar21 >> auVar32;
        output[2] = output[2] + iVar21 >> auVar32;
        output[3] = output[3] + iVar21 >> auVar32;
        output = output + 4;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
  }
  else if (3 < uVar25) {
    uVar20 = (ulong)uVar23;
    do {
      *output = *output << (int)(char)bVar2;
      output[1] = output[1];
      output[2] = output[2];
      output[3] = output[3];
      output = output + 4;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x32_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[1024]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_32X32, &cfg);
  (void)bd;
  fwd_txfm2d_sse4_1(input, output, stride, &cfg, txfm_buf);
}